

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

Vec_Bit_t * Acec_BoothFindPPG(Gia_Man_t *p)

{
  uint uVar1;
  int *__ptr;
  Vec_Bit_t *pVVar2;
  int *__s;
  Vec_Int_t *__ptr_00;
  long lVar3;
  int iVar4;
  size_t __size;
  int iVar5;
  
  iVar5 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  iVar4 = iVar5 * 0x20;
  pVVar2->nCap = iVar4;
  if (iVar5 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar5 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar4;
  memset(__s,0,__size);
  __ptr_00 = Acec_MultFindPPs(p);
  __ptr = __ptr_00->pArray;
  if (__ptr_00->nSize < 1) {
    if (__ptr == (int *)0x0) goto LAB_00679fee;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = __ptr[lVar3];
      if (((int)uVar1 < 0) || (iVar4 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr_00->nSize);
  }
  free(__ptr);
LAB_00679fee:
  free(__ptr_00);
  return pVVar2;
}

Assistant:

Vec_Bit_t * Acec_BoothFindPPG( Gia_Man_t * p )
{
    Vec_Bit_t * vIgnore = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap = Acec_MultFindPPs( p );
    int i, Entry;
    Vec_IntForEachEntry( vMap, Entry, i )
        Vec_BitWriteEntry( vIgnore, Entry, 1 );
    Vec_IntFree( vMap );
    return vIgnore;
}